

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O1

UNewTrie *
utrie_open_63(UNewTrie *fillIn,uint32_t *aliasData,int32_t maxDataLength,uint32_t initialValue,
             uint32_t leadUnitValue,UBool latin1Linear)

{
  int iVar1;
  UNewTrie *__s;
  uint32_t *puVar2;
  UBool UVar3;
  uint uVar4;
  long lVar5;
  
  if ((maxDataLength < 0x20) || (maxDataLength < 0x400 && latin1Linear != '\0')) {
LAB_0030839f:
    __s = (UNewTrie *)0x0;
  }
  else {
    __s = fillIn;
    if (fillIn == (UNewTrie *)0x0) {
      __s = (UNewTrie *)uprv_malloc_63(0x44120);
      if (__s == (UNewTrie *)0x0) goto LAB_0030839f;
    }
    memset(__s,0,0x44120);
    __s->isAllocated = fillIn == (UNewTrie *)0x0;
    if (aliasData == (uint32_t *)0x0) {
      puVar2 = (uint32_t *)uprv_malloc_63((ulong)(uint)(maxDataLength * 4));
      __s->data = puVar2;
      UVar3 = '\x01';
      if (puVar2 == (uint32_t *)0x0) {
        uprv_free_63(__s);
        goto LAB_0030839f;
      }
    }
    else {
      __s->data = aliasData;
      UVar3 = '\0';
    }
    __s->isDataAllocated = UVar3;
    if (latin1Linear == '\0') {
      uVar4 = 0x20;
    }
    else {
      iVar1 = 0x20;
      lVar5 = 0;
      do {
        __s->index[lVar5] = iVar1;
        lVar5 = lVar5 + 1;
        iVar1 = iVar1 + 0x20;
      } while (lVar5 != 8);
      uVar4 = 0x120;
    }
    __s->dataLength = uVar4;
    puVar2 = __s->data;
    lVar5 = (ulong)uVar4 + 1;
    do {
      puVar2[lVar5 + -2] = initialValue;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
    __s->leadUnitValue = leadUnitValue;
    __s->indexLength = 0x8800;
    __s->dataCapacity = maxDataLength;
    __s->isLatin1Linear = latin1Linear;
    __s->isCompacted = '\0';
  }
  return __s;
}

Assistant:

U_CAPI UNewTrie * U_EXPORT2
utrie_open(UNewTrie *fillIn,
           uint32_t *aliasData, int32_t maxDataLength,
           uint32_t initialValue, uint32_t leadUnitValue,
           UBool latin1Linear) {
    UNewTrie *trie;
    int32_t i, j;

    if( maxDataLength<UTRIE_DATA_BLOCK_LENGTH ||
        (latin1Linear && maxDataLength<1024)
    ) {
        return NULL;
    }

    if(fillIn!=NULL) {
        trie=fillIn;
    } else {
        trie=(UNewTrie *)uprv_malloc(sizeof(UNewTrie));
        if(trie==NULL) {
            return NULL;
        }
    }
    uprv_memset(trie, 0, sizeof(UNewTrie));
    trie->isAllocated= (UBool)(fillIn==NULL);

    if(aliasData!=NULL) {
        trie->data=aliasData;
        trie->isDataAllocated=FALSE;
    } else {
        trie->data=(uint32_t *)uprv_malloc(maxDataLength*4);
        if(trie->data==NULL) {
            uprv_free(trie);
            return NULL;
        }
        trie->isDataAllocated=TRUE;
    }

    /* preallocate and reset the first data block (block index 0) */
    j=UTRIE_DATA_BLOCK_LENGTH;

    if(latin1Linear) {
        /* preallocate and reset the first block (number 0) and Latin-1 (U+0000..U+00ff) after that */
        /* made sure above that maxDataLength>=1024 */

        /* set indexes to point to consecutive data blocks */
        i=0;
        do {
            /* do this at least for trie->index[0] even if that block is only partly used for Latin-1 */
            trie->index[i++]=j;
            j+=UTRIE_DATA_BLOCK_LENGTH;
        } while(i<(256>>UTRIE_SHIFT));
    }

    /* reset the initially allocated blocks to the initial value */
    trie->dataLength=j;
    while(j>0) {
        trie->data[--j]=initialValue;
    }

    trie->leadUnitValue=leadUnitValue;
    trie->indexLength=UTRIE_MAX_INDEX_LENGTH;
    trie->dataCapacity=maxDataLength;
    trie->isLatin1Linear=latin1Linear;
    trie->isCompacted=FALSE;
    return trie;
}